

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_complex.h
# Opt level: O1

void __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::remove_blocker
          (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this,
          Blocker_handle sigma,Vertex_handle v)

{
  iterator __position;
  _Self __tmp;
  Complex_blocker_around_vertex_range CVar1;
  
  CVar1 = blocker_range(this,v);
  __position._M_node =
       (_Base_ptr)
       CVar1.
       super_iterator_range_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>,_boost::iterators::incrementable_traversal_tag>
       .m_Begin.current_position_._M_node;
  while( true ) {
    CVar1 = blocker_range(this,v);
    if (((_Rb_tree_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>
          )__position._M_node ==
         CVar1.
         super_iterator_range_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>,_boost::iterators::incrementable_traversal_tag>
         .m_End.current_position_._M_node.current_position_) ||
       (__position._M_node[1]._M_parent == (_Base_ptr)sigma)) break;
    __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
  }
  if (__position._M_node[1]._M_parent == (_Base_ptr)sigma) {
    std::
    _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,std::pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle_const,Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>*>,std::_Select1st<std::pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle_const,Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>*>>,std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::allocator<std::pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle_const,Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>*>>>
    ::erase_abi_cxx11_((_Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,std::pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle_const,Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>*>,std::_Select1st<std::pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle_const,Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>*>>,std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::allocator<std::pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle_const,Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>*>>>
                        *)&this->blocker_map_,__position);
    return;
  }
  std::operator<<((ostream *)&std::cerr,
                  "bug ((*blocker).second == sigma) ie try to remove a blocker not present\n");
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/include/gudhi/Skeleton_blocker_complex.h"
                ,0x2d1,
                "void Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::remove_blocker(const Blocker_handle, Vertex_handle) [SkeletonBlockerDS = Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits]"
               );
}

Assistant:

void remove_blocker(const Blocker_handle sigma, Vertex_handle v) {
    Complex_blocker_around_vertex_iterator blocker;
    for (blocker = blocker_range(v).begin(); blocker != blocker_range(v).end();
         ++blocker) {
      if (*blocker == sigma)
        break;
    }
    if (*blocker != sigma) {
      std::cerr
          << "bug ((*blocker).second == sigma) ie try to remove a blocker not present\n";
      assert(false);
    } else {
      blocker_map_.erase(blocker.current_position());
    }
  }